

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

void secp256k1_ecmult_strauss_wnaf
               (secp256k1_strauss_state *state,secp256k1_gej *r,size_t num,secp256k1_gej *a,
               secp256k1_scalar *na,secp256k1_scalar *ng)

{
  long *plVar1;
  long *plVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  uint uVar172;
  int iVar173;
  uint uVar174;
  ulong in_RAX;
  ulong extraout_RAX;
  ulong uVar175;
  secp256k1_strauss_point_state *psVar176;
  uint uVar177;
  secp256k1_strauss_state *psVar178;
  long lVar179;
  ulong uVar180;
  ulong uVar181;
  secp256k1_gej *psVar182;
  long lVar183;
  long lVar184;
  secp256k1_fe *psVar185;
  long lVar186;
  ulong *puVar187;
  uint64_t *puVar188;
  secp256k1_gej *psVar189;
  secp256k1_fe *psVar190;
  ulong *puVar191;
  secp256k1_ge *psVar192;
  ulong uVar193;
  ulong uVar194;
  ulong uVar195;
  long lVar196;
  long lVar197;
  long lVar198;
  bool bVar199;
  byte bVar200;
  undefined1 auVar201 [16];
  secp256k1_scalar na_lam;
  uint64_t tmp3;
  secp256k1_fe Z;
  uint64_t tmp3_2;
  uint64_t tmp2_2;
  uint64_t tmp2;
  uint64_t tmp1;
  int wnaf_ng_128 [129];
  int wnaf_ng_1 [129];
  long local_560;
  long local_558;
  long local_548;
  undefined1 local_538 [64];
  long lStack_4f8;
  uint64_t local_4f0;
  int local_4e8;
  secp256k1_gej *local_4d8;
  secp256k1_scalar *local_4d0;
  ulong local_4c8;
  undefined1 local_4c0 [16];
  ulong uStack_4b0;
  undefined1 local_4a8 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  ulong local_468;
  uint64_t uStack_460;
  undefined1 local_458 [16];
  secp256k1_scalar local_448 [16];
  uint uStack_23c;
  secp256k1_gej local_238 [4];
  
  bVar200 = 0;
  local_4c0._0_8_ = 1;
  stack0xfffffffffffffb48 = (undefined1  [16])0x0;
  local_4a8 = (undefined1  [16])0x0;
  local_4d0 = ng;
  if (num == 0) {
    uVar177 = 0;
    lVar196 = 0;
    bVar199 = true;
  }
  else {
    psVar185 = &a->z;
    lVar196 = 0;
    uVar177 = 0;
    do {
      auVar201._0_4_ = -(uint)((int)na->d[2] == 0 && (int)na->d[0] == 0);
      auVar201._4_4_ = -(uint)(*(int *)((long)na->d + 0x14) == 0 && *(int *)((long)na->d + 4) == 0);
      auVar201._8_4_ = -(uint)((int)na->d[3] == 0 && (int)na->d[1] == 0);
      auVar201._12_4_ =
           -(uint)(*(int *)((long)na->d + 0x1c) == 0 && *(int *)((long)na->d + 0xc) == 0);
      uVar172 = movmskps((int)in_RAX,auVar201);
      in_RAX = (ulong)(uVar172 ^ 0xf);
      if (((uVar172 ^ 0xf) != 0) && (*(int *)(psVar185 + 1) == 0)) {
        psVar178 = state;
        secp256k1_scalar_split_lambda(local_448,(secp256k1_scalar *)local_538,na);
        iVar173 = secp256k1_ecmult_wnaf
                            (state->ps[lVar196].wnaf_na_1,(int)local_448,(secp256k1_scalar *)0x5,
                             (int)psVar178);
        psVar176 = state->ps;
        psVar176[lVar196].bits_na_1 = iVar173;
        uVar174 = secp256k1_ecmult_wnaf
                            (psVar176[lVar196].wnaf_na_lam,(int)local_538,(secp256k1_scalar *)0x5,
                             (int)psVar176);
        psVar176 = state->ps;
        psVar176[lVar196].bits_na_lam = uVar174;
        uVar172 = psVar176[lVar196].bits_na_1;
        if ((int)uVar177 < (int)uVar172) {
          uVar177 = uVar172;
        }
        if ((int)uVar177 < (int)uVar174) {
          uVar177 = uVar174;
        }
        psVar182 = (secp256k1_gej *)(psVar185 + -2);
        psVar189 = local_238;
        for (lVar179 = 0x10; lVar179 != 0; lVar179 = lVar179 + -1) {
          (psVar189->x).n[0] = (psVar182->x).n[0];
          psVar182 = (secp256k1_gej *)((long)psVar182 + (ulong)bVar200 * -0x10 + 8);
          psVar189 = (secp256k1_gej *)((long)psVar189 + (ulong)bVar200 * -0x10 + 8);
        }
        if (lVar196 != 0) {
          secp256k1_gej_rescale(local_238,(secp256k1_fe *)local_4c0);
        }
        secp256k1_ecmult_odd_multiples_table
                  ((int)lVar196 * 0x2c0 + (int)state->pre_a,
                   (secp256k1_ge *)(state->aux + lVar196 * 8),(secp256k1_fe *)local_4c0,
                   &local_238[0].x,(secp256k1_gej *)state);
        in_RAX = extraout_RAX;
        if (lVar196 != 0) {
          psVar190 = state->aux + lVar196 * 8;
          uVar181 = psVar190->n[0];
          uVar194 = psVar190->n[1];
          uVar3 = psVar190->n[2];
          uVar4 = psVar190->n[3];
          uVar5 = psVar190->n[4];
          auVar7._8_8_ = 0;
          auVar7._0_8_ = psVar185->n[0];
          auVar72._8_8_ = 0;
          auVar72._0_8_ = uVar4;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = psVar185->n[1];
          auVar73._8_8_ = 0;
          auVar73._0_8_ = uVar3;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = psVar185->n[2];
          auVar74._8_8_ = 0;
          auVar74._0_8_ = uVar194;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = psVar185->n[3];
          auVar75._8_8_ = 0;
          auVar75._0_8_ = uVar181;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = psVar185->n[4];
          auVar76._8_8_ = 0;
          auVar76._0_8_ = uVar5;
          uVar175 = SUB168(auVar11 * auVar76,0);
          auVar12._8_8_ = 0;
          auVar12._0_8_ = uVar175 & 0xfffffffffffff;
          auVar201 = auVar8 * auVar73 + auVar7 * auVar72 + auVar9 * auVar74 + auVar10 * auVar75 +
                     auVar12 * ZEXT816(0x1000003d10);
          uVar180 = auVar201._0_8_;
          local_468 = uVar180 & 0xfffffffffffff;
          auVar150._8_8_ = 0;
          auVar150._0_8_ = uVar180 >> 0x34 | auVar201._8_8_ << 0xc;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = psVar185->n[0];
          auVar77._8_8_ = 0;
          auVar77._0_8_ = uVar5;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = psVar185->n[1];
          auVar78._8_8_ = 0;
          auVar78._0_8_ = uVar4;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = psVar185->n[2];
          auVar79._8_8_ = 0;
          auVar79._0_8_ = uVar3;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = psVar185->n[3];
          auVar80._8_8_ = 0;
          auVar80._0_8_ = uVar194;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = psVar185->n[4];
          auVar81._8_8_ = 0;
          auVar81._0_8_ = uVar181;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = uVar175 >> 0x34 | SUB168(auVar11 * auVar76,8) << 0xc;
          auVar201 = auVar13 * auVar77 + auVar150 + auVar14 * auVar78 + auVar15 * auVar79 +
                     auVar16 * auVar80 + auVar17 * auVar81 + auVar18 * ZEXT816(0x1000003d10);
          uVar175 = auVar201._0_8_;
          auVar151._8_8_ = 0;
          auVar151._0_8_ = uVar175 >> 0x34 | auVar201._8_8_ << 0xc;
          local_4c8 = (uVar175 & 0xfffffffffffff) >> 0x30;
          local_488._0_8_ = uVar175 & 0xffffffffffff;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = psVar185->n[0];
          auVar82._8_8_ = 0;
          auVar82._0_8_ = uVar181;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = psVar185->n[1];
          auVar83._8_8_ = 0;
          auVar83._0_8_ = uVar5;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = psVar185->n[2];
          auVar84._8_8_ = 0;
          auVar84._0_8_ = uVar4;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = psVar185->n[3];
          auVar85._8_8_ = 0;
          auVar85._0_8_ = uVar3;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = psVar185->n[4];
          auVar86._8_8_ = 0;
          auVar86._0_8_ = uVar194;
          auVar201 = auVar20 * auVar83 + auVar151 + auVar21 * auVar84 + auVar22 * auVar85 +
                     auVar23 * auVar86;
          uVar180 = auVar201._0_8_;
          auVar153._8_8_ = 0;
          auVar153._0_8_ = uVar180 >> 0x34 | auVar201._8_8_ << 0xc;
          auVar87._8_8_ = 0;
          auVar87._0_8_ = (uVar180 & 0xfffffffffffff) << 4 | local_4c8;
          auVar201 = auVar19 * auVar82 + ZEXT816(0x1000003d1) * auVar87;
          uVar180 = auVar201._0_8_;
          psVar190->n[0] = uVar180 & 0xfffffffffffff;
          auVar152._8_8_ = 0;
          auVar152._0_8_ = uVar180 >> 0x34 | auVar201._8_8_ << 0xc;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = psVar185->n[0];
          auVar88._8_8_ = 0;
          auVar88._0_8_ = uVar194;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = psVar185->n[1];
          auVar89._8_8_ = 0;
          auVar89._0_8_ = uVar181;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = psVar185->n[2];
          auVar90._8_8_ = 0;
          auVar90._0_8_ = uVar5;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = psVar185->n[3];
          auVar91._8_8_ = 0;
          auVar91._0_8_ = uVar4;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = psVar185->n[4];
          auVar92._8_8_ = 0;
          auVar92._0_8_ = uVar3;
          auVar7 = auVar26 * auVar90 + auVar153 + auVar27 * auVar91 + auVar28 * auVar92;
          uVar180 = auVar7._0_8_;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = uVar180 & 0xfffffffffffff;
          auVar201 = auVar24 * auVar88 + auVar152 + auVar25 * auVar89 +
                     auVar29 * ZEXT816(0x1000003d10);
          uVar193 = auVar201._0_8_;
          auVar155._8_8_ = 0;
          auVar155._0_8_ = uVar180 >> 0x34 | auVar7._8_8_ << 0xc;
          psVar190->n[1] = uVar193 & 0xfffffffffffff;
          auVar154._8_8_ = 0;
          auVar154._0_8_ = uVar193 >> 0x34 | auVar201._8_8_ << 0xc;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = psVar185->n[0];
          auVar93._8_8_ = 0;
          auVar93._0_8_ = uVar3;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = psVar185->n[1];
          auVar94._8_8_ = 0;
          auVar94._0_8_ = uVar194;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = psVar185->n[2];
          auVar95._8_8_ = 0;
          auVar95._0_8_ = uVar181;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = psVar185->n[3];
          auVar96._8_8_ = 0;
          auVar96._0_8_ = uVar5;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = psVar185->n[4];
          auVar97._8_8_ = 0;
          auVar97._0_8_ = uVar4;
          auVar7 = auVar33 * auVar96 + auVar155 + auVar34 * auVar97;
          uVar181 = auVar7._0_8_;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = uVar181 & 0xfffffffffffff;
          auVar201 = auVar30 * auVar93 + auVar154 + auVar31 * auVar94 + auVar32 * auVar95 +
                     auVar35 * ZEXT816(0x1000003d10);
          uVar194 = auVar201._0_8_;
          psVar190->n[2] = uVar194 & 0xfffffffffffff;
          auVar156._8_8_ = 0;
          auVar156._0_8_ = (uVar194 >> 0x34 | auVar201._8_8_ << 0xc) + local_468;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = uVar181 >> 0x34 | auVar7._8_8_ << 0xc;
          auVar156 = auVar36 * ZEXT816(0x1000003d10) + auVar156;
          uVar181 = auVar156._0_8_;
          in_RAX = uVar181 & 0xfffffffffffff;
          psVar190->n[3] = in_RAX;
          psVar190->n[4] = (uVar181 >> 0x34 | auVar156._8_8_ << 0xc) + (uVar175 & 0xffffffffffff);
        }
        lVar196 = lVar196 + 1;
      }
      psVar185 = (secp256k1_fe *)((long)(psVar185 + 3) + 8);
      na = na + 1;
      num = num - 1;
    } while (num != 0);
    bVar199 = lVar196 == 0;
    if (bVar199) {
      lVar196 = 0;
      a = (secp256k1_gej *)state;
      bVar199 = true;
    }
    else {
      local_4d8 = r;
      secp256k1_ge_table_set_globalz(lVar196 * 8,state->pre_a,state->aux);
      lVar179 = 0;
      a = (secp256k1_gej *)0x0;
      lVar184 = 0;
      do {
        lVar186 = 0;
        psVar182 = a;
        do {
          puVar191 = (ulong *)((long)state->aux->n + lVar186 + lVar179);
          puVar187 = (ulong *)((long)(state->pre_a->x).n + (long)(psVar182->x).n);
          uVar181 = *puVar187;
          uVar194 = puVar187[1];
          uVar3 = puVar187[2];
          uVar4 = puVar187[3];
          uVar5 = puVar187[4];
          auVar98._8_8_ = 0;
          auVar98._0_8_ = uVar4;
          auVar99._8_8_ = 0;
          auVar99._0_8_ = uVar3;
          auVar100._8_8_ = 0;
          auVar100._0_8_ = uVar194;
          auVar101._8_8_ = 0;
          auVar101._0_8_ = uVar181;
          auVar102._8_8_ = 0;
          auVar102._0_8_ = uVar5;
          uVar175 = SUB168(ZEXT816(0x7ae96a2b657c) * auVar102,0);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = uVar175 & 0xfffffffffffff;
          auVar201 = ZEXT816(0x7512f58995c13) * auVar99 + ZEXT816(0x96c28719501ee) * auVar98 +
                     ZEXT816(0xc3434e99cf049) * auVar100 + ZEXT816(0x7106e64479ea) * auVar101 +
                     auVar37 * ZEXT816(0x1000003d10);
          uVar180 = auVar201._0_8_;
          local_238[0].x.n[0] = uVar180 & 0xfffffffffffff;
          auVar157._8_8_ = 0;
          auVar157._0_8_ = uVar180 >> 0x34 | auVar201._8_8_ << 0xc;
          auVar103._8_8_ = 0;
          auVar103._0_8_ = uVar5;
          auVar104._8_8_ = 0;
          auVar104._0_8_ = uVar4;
          auVar105._8_8_ = 0;
          auVar105._0_8_ = uVar3;
          auVar106._8_8_ = 0;
          auVar106._0_8_ = uVar194;
          auVar107._8_8_ = 0;
          auVar107._0_8_ = uVar181;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar175 >> 0x34 | SUB168(ZEXT816(0x7ae96a2b657c) * auVar102,8) << 0xc;
          auVar201 = ZEXT816(0x96c28719501ee) * auVar103 + auVar157 +
                     ZEXT816(0x7512f58995c13) * auVar104 + ZEXT816(0xc3434e99cf049) * auVar105 +
                     ZEXT816(0x7106e64479ea) * auVar106 + ZEXT816(0x7ae96a2b657c) * auVar107 +
                     auVar38 * ZEXT816(0x1000003d10);
          uVar175 = auVar201._0_8_;
          auVar158._8_8_ = 0;
          auVar158._0_8_ = uVar175 >> 0x34 | auVar201._8_8_ << 0xc;
          local_538._0_8_ = (uVar175 & 0xfffffffffffff) >> 0x30;
          local_448[0].d[0] = uVar175 & 0xffffffffffff;
          auVar108._8_8_ = 0;
          auVar108._0_8_ = uVar181;
          auVar109._8_8_ = 0;
          auVar109._0_8_ = uVar5;
          auVar110._8_8_ = 0;
          auVar110._0_8_ = uVar4;
          auVar111._8_8_ = 0;
          auVar111._0_8_ = uVar3;
          auVar112._8_8_ = 0;
          auVar112._0_8_ = uVar194;
          auVar201 = ZEXT816(0x7512f58995c13) * auVar109 + auVar158 +
                     ZEXT816(0xc3434e99cf049) * auVar110 + ZEXT816(0x7106e64479ea) * auVar111 +
                     ZEXT816(0x7ae96a2b657c) * auVar112;
          uVar180 = auVar201._0_8_;
          auVar160._8_8_ = 0;
          auVar160._0_8_ = uVar180 >> 0x34 | auVar201._8_8_ << 0xc;
          auVar113._8_8_ = 0;
          auVar113._0_8_ = (uVar180 & 0xfffffffffffff) << 4 | local_538._0_8_;
          auVar201 = ZEXT816(0x96c28719501ee) * auVar108 + ZEXT816(0x1000003d1) * auVar113;
          uVar180 = auVar201._0_8_;
          *puVar191 = uVar180 & 0xfffffffffffff;
          auVar159._8_8_ = 0;
          auVar159._0_8_ = uVar180 >> 0x34 | auVar201._8_8_ << 0xc;
          auVar114._8_8_ = 0;
          auVar114._0_8_ = uVar194;
          auVar115._8_8_ = 0;
          auVar115._0_8_ = uVar181;
          auVar116._8_8_ = 0;
          auVar116._0_8_ = uVar5;
          auVar117._8_8_ = 0;
          auVar117._0_8_ = uVar4;
          auVar118._8_8_ = 0;
          auVar118._0_8_ = uVar3;
          auVar7 = ZEXT816(0xc3434e99cf049) * auVar116 + auVar160 +
                   ZEXT816(0x7106e64479ea) * auVar117 + ZEXT816(0x7ae96a2b657c) * auVar118;
          uVar180 = auVar7._0_8_;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = uVar180 & 0xfffffffffffff;
          auVar201 = ZEXT816(0x96c28719501ee) * auVar114 + auVar159 +
                     ZEXT816(0x7512f58995c13) * auVar115 + auVar39 * ZEXT816(0x1000003d10);
          uVar193 = auVar201._0_8_;
          auVar162._8_8_ = 0;
          auVar162._0_8_ = uVar180 >> 0x34 | auVar7._8_8_ << 0xc;
          puVar191[1] = uVar193 & 0xfffffffffffff;
          auVar161._8_8_ = 0;
          auVar161._0_8_ = uVar193 >> 0x34 | auVar201._8_8_ << 0xc;
          auVar119._8_8_ = 0;
          auVar119._0_8_ = uVar3;
          auVar120._8_8_ = 0;
          auVar120._0_8_ = uVar194;
          auVar121._8_8_ = 0;
          auVar121._0_8_ = uVar181;
          auVar122._8_8_ = 0;
          auVar122._0_8_ = uVar5;
          auVar123._8_8_ = 0;
          auVar123._0_8_ = uVar4;
          auVar7 = ZEXT816(0x7106e64479ea) * auVar122 + auVar162 +
                   ZEXT816(0x7ae96a2b657c) * auVar123;
          uVar181 = auVar7._0_8_;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = uVar181 & 0xfffffffffffff;
          auVar201 = ZEXT816(0x96c28719501ee) * auVar119 + auVar161 +
                     ZEXT816(0x7512f58995c13) * auVar120 + ZEXT816(0xc3434e99cf049) * auVar121 +
                     auVar40 * ZEXT816(0x1000003d10);
          uVar194 = auVar201._0_8_;
          puVar191[2] = uVar194 & 0xfffffffffffff;
          auVar163._8_8_ = 0;
          auVar163._0_8_ = (uVar194 >> 0x34 | auVar201._8_8_ << 0xc) + local_238[0].x.n[0];
          auVar41._8_8_ = 0;
          auVar41._0_8_ = uVar181 >> 0x34 | auVar7._8_8_ << 0xc;
          auVar163 = auVar41 * ZEXT816(0x1000003d10) + auVar163;
          uVar181 = auVar163._0_8_;
          puVar191[3] = uVar181 & 0xfffffffffffff;
          puVar191[4] = (uVar181 >> 0x34 | auVar163._8_8_ << 0xc) + (uVar175 & 0xffffffffffff);
          psVar182 = (secp256k1_gej *)((psVar182->z).n + 1);
          lVar186 = lVar186 + 0x28;
        } while (lVar186 != 0x140);
        lVar184 = lVar184 + 1;
        a = (secp256k1_gej *)(a[5].y.n + 3);
        lVar179 = lVar179 + 0x140;
        r = local_4d8;
      } while (lVar184 != lVar196);
    }
  }
  iVar173 = (int)a;
  if (local_4d0 == (secp256k1_scalar *)0x0) {
    local_548 = 0;
    local_558 = 0;
  }
  else {
    local_468 = local_4d0->d[0];
    uStack_460 = local_4d0->d[1];
    local_458 = (undefined1  [16])0x0;
    local_488 = *(undefined1 (*) [16])(local_4d0->d + 2);
    local_478 = (undefined1  [16])0x0;
    uVar172 = secp256k1_ecmult_wnaf
                        ((int *)local_238,(int)&local_468,(secp256k1_scalar *)0xf,iVar173);
    uVar174 = secp256k1_ecmult_wnaf((int *)local_448,(int)local_488,(secp256k1_scalar *)0xf,iVar173)
    ;
    if ((int)uVar177 < (int)uVar172) {
      uVar177 = uVar172;
    }
    if ((int)uVar177 < (int)uVar174) {
      uVar177 = uVar174;
    }
    local_558 = (long)(int)uVar174;
    local_548 = (long)(int)uVar172;
  }
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  if (0 < (int)uVar177) {
    local_560 = (ulong)uVar177 * 4;
    uVar181 = (ulong)uVar177;
    do {
      local_560 = local_560 + -4;
      if (r->infinity == 0) {
        secp256k1_gej_double(r,r);
      }
      else {
        r->infinity = 1;
        (r->x).n[0] = 0;
        (r->x).n[1] = 0;
        (r->x).n[2] = 0;
        (r->x).n[3] = 0;
        *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
        (r->y).n[1] = 0;
        (r->y).n[2] = 0;
        (r->y).n[3] = 0;
        (r->y).n[4] = 0;
        (r->z).n[0] = 0;
        (r->z).n[1] = 0;
        (r->z).n[2] = 0;
        (r->z).n[3] = 0;
        (r->z).n[4] = 0;
      }
      if (!bVar199) {
        lVar198 = 0x40c;
        lVar197 = 0;
        lVar186 = 0;
        lVar179 = local_560;
        lVar184 = lVar196;
        do {
          psVar176 = state->ps;
          if (((long)uVar181 <= (long)*(int *)((long)psVar176->wnaf_na_1 + lVar198 + -4)) &&
             (uVar177 = *(uint *)((long)psVar176->wnaf_na_1 + lVar179), uVar177 != 0)) {
            if ((int)uVar177 < 1) {
              puVar188 = (uint64_t *)((long)state->pre_a[~uVar177 >> 1].x.n + lVar186);
              psVar192 = (secp256k1_ge *)local_538;
              for (lVar183 = 0xb; lVar183 != 0; lVar183 = lVar183 + -1) {
                (psVar192->x).n[0] = *puVar188;
                puVar188 = puVar188 + (ulong)bVar200 * -2 + 1;
                psVar192 = (secp256k1_ge *)((long)psVar192 + (ulong)bVar200 * -0x10 + 8);
              }
              local_538._40_8_ = 0x3ffffbfffff0bc - local_538._40_8_;
              local_538._48_8_ = 0x3ffffffffffffc - local_538._48_8_;
              lVar183 = local_538._56_8_;
              lStack_4f8 = 0x3ffffffffffffc - local_538._64_8_;
              local_538._56_8_ = 0x3ffffffffffffc - lVar183;
              local_4f0 = 0x3fffffffffffc - local_4f0;
            }
            else {
              puVar188 = (uint64_t *)((long)state->pre_a[uVar177 - 1 >> 1].x.n + lVar186);
              psVar192 = (secp256k1_ge *)local_538;
              for (lVar183 = 0xb; lVar183 != 0; lVar183 = lVar183 + -1) {
                (psVar192->x).n[0] = *puVar188;
                puVar188 = puVar188 + (ulong)bVar200 * -2 + 1;
                psVar192 = (secp256k1_ge *)((long)psVar192 + (ulong)bVar200 * -0x10 + 8);
              }
            }
            secp256k1_gej_add_ge_var(r,r,(secp256k1_ge *)local_538,(secp256k1_fe *)0x0);
            psVar176 = state->ps;
          }
          if (((long)uVar181 <= (long)*(int *)((long)psVar176->wnaf_na_1 + lVar198)) &&
             (uVar177 = *(uint *)((long)psVar176->wnaf_na_lam + lVar179), uVar177 != 0)) {
            psVar185 = state->aux;
            psVar192 = state->pre_a;
            local_4e8 = 0;
            if ((int)uVar177 < 1) {
              uVar177 = ~uVar177 >> 1;
              local_538._32_8_ = *(uint64_t *)((long)psVar185[uVar177].n + lVar197 + 0x20);
              puVar187 = (ulong *)((long)psVar185[uVar177].n + lVar197);
              local_538._0_8_ = *puVar187;
              local_538._8_8_ = puVar187[1];
              puVar188 = (uint64_t *)((long)psVar185[uVar177].n + lVar197 + 0x10);
              local_538._16_8_ = *puVar188;
              local_538._24_8_ = puVar188[1];
              plVar1 = (long *)((long)psVar192[uVar177].y.n + lVar186);
              plVar2 = (long *)((long)psVar192[uVar177].y.n + lVar186 + 0x10);
              local_538._40_8_ = 0x3ffffbfffff0bc - *plVar1;
              local_538._48_8_ = 0x3ffffffffffffc - plVar1[1];
              lStack_4f8 = 0x3ffffffffffffc - plVar2[1];
              local_538._56_8_ = 0x3ffffffffffffc - *plVar2;
              local_4f0 = 0x3fffffffffffc - *(long *)((long)psVar192[uVar177].y.n + lVar186 + 0x20);
            }
            else {
              uVar177 = uVar177 - 1 >> 1;
              local_538._32_8_ = *(uint64_t *)((long)psVar185[uVar177].n + lVar197 + 0x20);
              puVar187 = (ulong *)((long)psVar185[uVar177].n + lVar197);
              local_538._0_8_ = *puVar187;
              local_538._8_8_ = puVar187[1];
              puVar188 = (uint64_t *)((long)psVar185[uVar177].n + lVar197 + 0x10);
              local_538._16_8_ = *puVar188;
              local_538._24_8_ = puVar188[1];
              local_4f0 = *(uint64_t *)((long)psVar192[uVar177].y.n + lVar186 + 0x20);
              puVar188 = (uint64_t *)((long)psVar192[uVar177].y.n + lVar186);
              local_538._40_8_ = *puVar188;
              local_538._48_8_ = puVar188[1];
              unique0x00006c80 =
                   *(undefined1 (*) [16])((long)psVar192[uVar177].y.n + lVar186 + 0x10);
            }
            secp256k1_gej_add_ge_var(r,r,(secp256k1_ge *)local_538,(secp256k1_fe *)0x0);
          }
          lVar179 = lVar179 + 0x410;
          lVar198 = lVar198 + 0x410;
          lVar186 = lVar186 + 0x2c0;
          lVar197 = lVar197 + 0x140;
          lVar184 = lVar184 + -1;
        } while (lVar184 != 0);
      }
      if (((long)uVar181 <= local_548) &&
         (uVar177 = *(uint *)((long)local_238[0].x.n + uVar181 * 4 + -4), uVar177 != 0)) {
        if ((int)uVar177 < 1) {
          secp256k1_ge_from_storage((secp256k1_ge *)local_538,secp256k1_pre_g + (~uVar177 >> 1));
          local_538._40_8_ = 0x3ffffbfffff0bc - local_538._40_8_;
          local_538._48_8_ = 0x3ffffffffffffc - local_538._48_8_;
          lVar179 = local_538._56_8_;
          lStack_4f8 = 0x3ffffffffffffc - local_538._64_8_;
          local_538._56_8_ = 0x3ffffffffffffc - lVar179;
          local_4f0 = 0x3fffffffffffc - local_4f0;
        }
        else {
          secp256k1_ge_from_storage((secp256k1_ge *)local_538,secp256k1_pre_g + (uVar177 - 1 >> 1));
        }
        secp256k1_gej_add_zinv_var(r,r,(secp256k1_ge *)local_538,(secp256k1_fe *)local_4c0);
      }
      if (((long)uVar181 <= local_558) &&
         (uVar177 = *(uint *)((long)local_448[0].d + uVar181 * 4 + -4), uVar177 != 0)) {
        if ((int)uVar177 < 1) {
          secp256k1_ge_from_storage((secp256k1_ge *)local_538,secp256k1_pre_g_128 + (~uVar177 >> 1))
          ;
          local_538._40_8_ = 0x3ffffbfffff0bc - local_538._40_8_;
          local_538._48_8_ = 0x3ffffffffffffc - local_538._48_8_;
          lVar179 = local_538._56_8_;
          lStack_4f8 = 0x3ffffffffffffc - local_538._64_8_;
          local_538._56_8_ = 0x3ffffffffffffc - lVar179;
          local_4f0 = 0x3fffffffffffc - local_4f0;
        }
        else {
          secp256k1_ge_from_storage
                    ((secp256k1_ge *)local_538,secp256k1_pre_g_128 + (uVar177 - 1 >> 1));
        }
        secp256k1_gej_add_zinv_var(r,r,(secp256k1_ge *)local_538,(secp256k1_fe *)local_4c0);
      }
      bVar6 = 1 < (long)uVar181;
      uVar181 = uVar181 - 1;
    } while (bVar6);
    if (r->infinity == 0) {
      uVar181 = (r->z).n[0];
      uVar194 = (r->z).n[1];
      uVar3 = (r->z).n[2];
      uVar4 = (r->z).n[3];
      uVar5 = (r->z).n[4];
      auVar42._8_8_ = 0;
      auVar42._0_8_ = local_4c0._0_8_;
      auVar124._8_8_ = 0;
      auVar124._0_8_ = uVar4;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_4c0._8_8_;
      auVar125._8_8_ = 0;
      auVar125._0_8_ = uVar3;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uStack_4b0;
      auVar126._8_8_ = 0;
      auVar126._0_8_ = uVar194;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_4a8._0_8_;
      auVar127._8_8_ = 0;
      auVar127._0_8_ = uVar181;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_4a8._8_8_;
      auVar128._8_8_ = 0;
      auVar128._0_8_ = uVar5;
      uVar175 = SUB168(auVar46 * auVar128,0);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar175 & 0xfffffffffffff;
      auVar201 = auVar43 * auVar125 + auVar42 * auVar124 + auVar44 * auVar126 + auVar45 * auVar127 +
                 auVar47 * ZEXT816(0x1000003d10);
      uVar180 = auVar201._0_8_;
      auVar164._8_8_ = 0;
      auVar164._0_8_ = uVar180 >> 0x34 | auVar201._8_8_ << 0xc;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_4c0._0_8_;
      auVar129._8_8_ = 0;
      auVar129._0_8_ = uVar5;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_4c0._8_8_;
      auVar130._8_8_ = 0;
      auVar130._0_8_ = uVar4;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uStack_4b0;
      auVar131._8_8_ = 0;
      auVar131._0_8_ = uVar3;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = local_4a8._0_8_;
      auVar132._8_8_ = 0;
      auVar132._0_8_ = uVar194;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_4a8._8_8_;
      auVar133._8_8_ = 0;
      auVar133._0_8_ = uVar181;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar175 >> 0x34 | SUB168(auVar46 * auVar128,8) << 0xc;
      auVar201 = auVar48 * auVar129 + auVar164 + auVar49 * auVar130 + auVar50 * auVar131 +
                 auVar51 * auVar132 + auVar52 * auVar133 + auVar53 * ZEXT816(0x1000003d10);
      uVar175 = auVar201._0_8_;
      auVar166._8_8_ = 0;
      auVar166._0_8_ = uVar175 >> 0x34 | auVar201._8_8_ << 0xc;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = local_4c0._0_8_;
      auVar134._8_8_ = 0;
      auVar134._0_8_ = uVar181;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = local_4c0._8_8_;
      auVar135._8_8_ = 0;
      auVar135._0_8_ = uVar5;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uStack_4b0;
      auVar136._8_8_ = 0;
      auVar136._0_8_ = uVar4;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = local_4a8._0_8_;
      auVar137._8_8_ = 0;
      auVar137._0_8_ = uVar3;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = local_4a8._8_8_;
      auVar138._8_8_ = 0;
      auVar138._0_8_ = uVar194;
      auVar201 = auVar55 * auVar135 + auVar166 + auVar56 * auVar136 + auVar57 * auVar137 +
                 auVar58 * auVar138;
      uVar193 = auVar201._0_8_;
      auVar168._8_8_ = 0;
      auVar168._0_8_ = uVar193 >> 0x34 | auVar201._8_8_ << 0xc;
      auVar139._8_8_ = 0;
      auVar139._0_8_ = (uVar193 & 0xfffffffffffff) << 4 | (uVar175 & 0xfffffffffffff) >> 0x30;
      uVar193 = auVar165._0_8_;
      auVar165 = auVar54 * auVar134 + ZEXT816(0x1000003d1) * auVar139;
      (r->z).n[0] = uVar193 & 0xfffffffffffff;
      auVar167._8_8_ = 0;
      auVar167._0_8_ = uVar193 >> 0x34 | auVar165._8_8_ << 0xc;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_4c0._0_8_;
      auVar140._8_8_ = 0;
      auVar140._0_8_ = uVar194;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = local_4c0._8_8_;
      auVar141._8_8_ = 0;
      auVar141._0_8_ = uVar181;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uStack_4b0;
      auVar142._8_8_ = 0;
      auVar142._0_8_ = uVar5;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = local_4a8._0_8_;
      auVar143._8_8_ = 0;
      auVar143._0_8_ = uVar4;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = local_4a8._8_8_;
      auVar144._8_8_ = 0;
      auVar144._0_8_ = uVar3;
      auVar7 = auVar61 * auVar142 + auVar168 + auVar62 * auVar143 + auVar63 * auVar144;
      uVar193 = auVar7._0_8_;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = uVar193 & 0xfffffffffffff;
      auVar201 = auVar59 * auVar140 + auVar167 + auVar60 * auVar141 +
                 auVar64 * ZEXT816(0x1000003d10);
      uVar195 = auVar201._0_8_;
      auVar170._8_8_ = 0;
      auVar170._0_8_ = uVar193 >> 0x34 | auVar7._8_8_ << 0xc;
      (r->z).n[1] = uVar195 & 0xfffffffffffff;
      auVar169._8_8_ = 0;
      auVar169._0_8_ = uVar195 >> 0x34 | auVar201._8_8_ << 0xc;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = local_4c0._0_8_;
      auVar145._8_8_ = 0;
      auVar145._0_8_ = uVar3;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = local_4c0._8_8_;
      auVar146._8_8_ = 0;
      auVar146._0_8_ = uVar194;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = uStack_4b0;
      auVar147._8_8_ = 0;
      auVar147._0_8_ = uVar181;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = local_4a8._0_8_;
      auVar148._8_8_ = 0;
      auVar148._0_8_ = uVar5;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = local_4a8._8_8_;
      auVar149._8_8_ = 0;
      auVar149._0_8_ = uVar4;
      auVar7 = auVar68 * auVar148 + auVar170 + auVar69 * auVar149;
      uVar181 = auVar7._0_8_;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = uVar181 & 0xfffffffffffff;
      auVar201 = auVar65 * auVar145 + auVar169 + auVar66 * auVar146 + auVar67 * auVar147 +
                 auVar70 * ZEXT816(0x1000003d10);
      uVar194 = auVar201._0_8_;
      (r->z).n[2] = uVar194 & 0xfffffffffffff;
      auVar171._8_8_ = 0;
      auVar171._0_8_ = (uVar194 >> 0x34 | auVar201._8_8_ << 0xc) + (uVar180 & 0xfffffffffffff);
      auVar71._8_8_ = 0;
      auVar71._0_8_ = uVar181 >> 0x34 | auVar7._8_8_ << 0xc;
      auVar171 = auVar71 * ZEXT816(0x1000003d10) + auVar171;
      uVar181 = auVar171._0_8_;
      (r->z).n[3] = uVar181 & 0xfffffffffffff;
      (r->z).n[4] = (uVar181 >> 0x34 | auVar171._8_8_ << 0xc) + (uVar175 & 0xffffffffffff);
    }
  }
  return;
}

Assistant:

static void secp256k1_ecmult_strauss_wnaf(const struct secp256k1_strauss_state *state, secp256k1_gej *r, size_t num, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_ge tmpa;
    secp256k1_fe Z;
    /* Split G factors. */
    secp256k1_scalar ng_1, ng_128;
    int wnaf_ng_1[129];
    int bits_ng_1 = 0;
    int wnaf_ng_128[129];
    int bits_ng_128 = 0;
    int i;
    int bits = 0;
    size_t np;
    size_t no = 0;

    secp256k1_fe_set_int(&Z, 1);
    for (np = 0; np < num; ++np) {
        secp256k1_gej tmp;
        secp256k1_scalar na_1, na_lam;
        if (secp256k1_scalar_is_zero(&na[np]) || secp256k1_gej_is_infinity(&a[np])) {
            continue;
        }
        /* split na into na_1 and na_lam (where na = na_1 + na_lam*lambda, and na_1 and na_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&na_1, &na_lam, &na[np]);

        /* build wnaf representation for na_1 and na_lam. */
        state->ps[no].bits_na_1   = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_1,   129, &na_1,   WINDOW_A);
        state->ps[no].bits_na_lam = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_lam, 129, &na_lam, WINDOW_A);
        VERIFY_CHECK(state->ps[no].bits_na_1 <= 129);
        VERIFY_CHECK(state->ps[no].bits_na_lam <= 129);
        if (state->ps[no].bits_na_1 > bits) {
            bits = state->ps[no].bits_na_1;
        }
        if (state->ps[no].bits_na_lam > bits) {
            bits = state->ps[no].bits_na_lam;
        }

        /* Calculate odd multiples of a.
         * All multiples are brought to the same Z 'denominator', which is stored
         * in Z. Due to secp256k1' isomorphism we can do all operations pretending
         * that the Z coordinate was 1, use affine addition formulae, and correct
         * the Z coordinate of the result once at the end.
         * The exception is the precomputed G table points, which are actually
         * affine. Compared to the base used for other points, they have a Z ratio
         * of 1/Z, so we can use secp256k1_gej_add_zinv_var, which uses the same
         * isomorphism to efficiently add with a known Z inverse.
         */
        tmp = a[np];
        if (no) {
            secp256k1_gej_rescale(&tmp, &Z);
        }
        secp256k1_ecmult_odd_multiples_table(ECMULT_TABLE_SIZE(WINDOW_A), state->pre_a + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &Z, &tmp);
        if (no) secp256k1_fe_mul(state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &(a[np].z));

        ++no;
    }

    /* Bring them to the same Z denominator. */
    if (no) {
        secp256k1_ge_table_set_globalz(ECMULT_TABLE_SIZE(WINDOW_A) * no, state->pre_a, state->aux);
    }

    for (np = 0; np < no; ++np) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_fe_mul(&state->aux[np * ECMULT_TABLE_SIZE(WINDOW_A) + i], &state->pre_a[np * ECMULT_TABLE_SIZE(WINDOW_A) + i].x, &secp256k1_const_beta);
        }
    }

    if (ng) {
        /* split ng into ng_1 and ng_128 (where gn = gn_1 + gn_128*2^128, and gn_1 and gn_128 are ~128 bit) */
        secp256k1_scalar_split_128(&ng_1, &ng_128, ng);

        /* Build wnaf representation for ng_1 and ng_128 */
        bits_ng_1   = secp256k1_ecmult_wnaf(wnaf_ng_1,   129, &ng_1,   WINDOW_G);
        bits_ng_128 = secp256k1_ecmult_wnaf(wnaf_ng_128, 129, &ng_128, WINDOW_G);
        if (bits_ng_1 > bits) {
            bits = bits_ng_1;
        }
        if (bits_ng_128 > bits) {
            bits = bits_ng_128;
        }
    }

    secp256k1_gej_set_infinity(r);

    for (i = bits - 1; i >= 0; i--) {
        int n;
        secp256k1_gej_double_var(r, r, NULL);
        for (np = 0; np < no; ++np) {
            if (i < state->ps[np].bits_na_1 && (n = state->ps[np].wnaf_na_1[i])) {
                secp256k1_ecmult_table_get_ge(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
            if (i < state->ps[np].bits_na_lam && (n = state->ps[np].wnaf_na_lam[i])) {
                secp256k1_ecmult_table_get_ge_lambda(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
        }
        if (i < bits_ng_1 && (n = wnaf_ng_1[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
        if (i < bits_ng_128 && (n = wnaf_ng_128[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g_128, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
    }

    if (!r->infinity) {
        secp256k1_fe_mul(&r->z, &r->z, &Z);
    }
}